

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O0

AlignedSentencePair * __thiscall
jhu::thrax::readAlignedSentencePair<false,false>
          (AlignedSentencePair *__return_storage_ptr__,thrax *this,string_view line)

{
  string_view line_00;
  string_view line_01;
  reference pvVar1;
  char *pcVar2;
  string_view sv;
  Alignment local_f0;
  size_t local_c8;
  char *pcStack_c0;
  Sentence local_b0;
  size_t local_98;
  char *pcStack_90;
  Sentence local_80;
  thrax *local_68;
  size_t sStack_60;
  undefined1 local_50 [8];
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> fs;
  string_view line_local;
  
  pcVar2 = line._M_str;
  sStack_60 = line._M_len;
  local_68 = this;
  fs._M_elems[2]._M_str = (char *)this;
  fields((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)local_50,this,line);
  pvVar1 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                     ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)local_50,
                      0);
  local_98 = pvVar1->_M_len;
  pcStack_90 = pvVar1->_M_str;
  line_00._M_len = pvVar1->_M_len;
  line_00._M_str = pvVar1->_M_str;
  tokens<false>(&local_80,line_00);
  pvVar1 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                     ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)local_50,
                      1);
  local_c8 = pvVar1->_M_len;
  pcStack_c0 = pvVar1->_M_str;
  line_01._M_len = pvVar1->_M_len;
  line_01._M_str = pvVar1->_M_str;
  tokens<false>(&local_b0,line_01);
  pvVar1 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::operator[]
                     ((array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> *)local_50,
                      2);
  sv._M_str = pcVar2;
  sv._M_len = (size_t)pvVar1->_M_str;
  readAlignment(&local_f0,(thrax *)pvVar1->_M_len,sv);
  AlignedSentencePair::AlignedSentencePair(__return_storage_ptr__,&local_80,&local_b0,&local_f0);
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~vector(&local_f0);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_b0);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector(&local_80);
  return __return_storage_ptr__;
}

Assistant:

AlignedSentencePair readAlignedSentencePair(std::string_view line) {
  auto fs = fields(line);
  static_assert(std::tuple_size<decltype(fs)>::value == 3);
  return {
    tokens<SourceIsParsed>(fs[0]),
    tokens<TargetIsParsed>(fs[1]),
    readAlignment(fs[2])
  };
}